

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLException.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLException::loadExceptText
          (XMLException *this,Codes toLoad,XMLCh *text1,XMLCh *text2,XMLCh *text3,XMLCh *text4)

{
  char cVar1;
  XMLCh *pXVar2;
  undefined4 in_register_00000034;
  undefined1 *toRep;
  XMLCh errText [4096];
  
  toRep = (undefined1 *)errText;
  this->fCode = toLoad;
  cVar1 = (**(code **)(*sMsgLoader + 0x18))
                    (sMsgLoader,CONCAT44(in_register_00000034,toLoad),errText,0xfff,text1,text2,
                     text3,text4,this->fMemoryManager);
  if (cVar1 == '\0') {
    toRep = XMLUni::fgDefErrMsg;
  }
  pXVar2 = XMLString::replicate((XMLCh *)toRep,this->fMemoryManager);
  this->fMsg = pXVar2;
  return;
}

Assistant:

void
XMLException::loadExceptText(const  XMLExcepts::Codes toLoad
                            , const XMLCh* const        text1
                            , const XMLCh* const        text2
                            , const XMLCh* const        text3
                            , const XMLCh* const        text4)
{
    // Store the error code
    fCode = toLoad;

    // Load up the text into a local buffer
    const XMLSize_t msgSize = 4095;
    XMLCh errText[msgSize + 1];

    // load the text
	if (!gGetMsgLoader().loadMsg(toLoad, errText, msgSize, text1, text2, text3, text4, fMemoryManager))
	{
		fMsg = XMLString::replicate
        (
        XMLUni::fgDefErrMsg
            , fMemoryManager
        );
		return;
	}

    // We got the text so replicate it into the message member
    fMsg = XMLString::replicate(errText, fMemoryManager);
}